

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple(Aig_Man_t *pMiter,Vec_Int_t *vPairs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Ssw_Cla_t *p;
  Aig_Obj_t **ppAVar6;
  long lVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  
  p = Ssw_ClassesStart(pMiter);
  uVar9 = (ulong)vPairs->nSize;
  ppAVar6 = (Aig_Obj_t **)malloc(uVar9 * 8);
  p->pMemClasses = ppAVar6;
  if (0 < (long)uVar9) {
    lVar7 = 1;
    do {
      pVVar4 = pMiter->vObjs;
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = vPairs->pArray[lVar7 + -1];
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_00906f46;
        pAVar8 = (Aig_Obj_t *)pVVar4->pArray[uVar1];
      }
      if ((int)uVar9 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = vPairs->pArray[lVar7];
      if (((long)iVar2 < 0) || (pVVar4->nSize <= iVar2)) {
LAB_00906f46:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar5 = (Aig_Obj_t *)pVVar4->pArray[iVar2];
      iVar2 = pAVar8->Id;
      iVar3 = pAVar5->Id;
      if (iVar3 <= iVar2) {
        __assert_fail("Aig_ObjId(pRepr) < Aig_ObjId(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswClass.c"
                      ,0x3af,"Ssw_Cla_t *Ssw_ClassesPreparePairsSimple(Aig_Man_t *, Vec_Int_t *)");
      }
      if (pMiter->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pMiter->pReprs[iVar3] = pAVar8;
      *ppAVar6 = pAVar8;
      ppAVar6[1] = pAVar5;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
        __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswClass.c"
                      ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pId2Class[iVar2] = ppAVar6;
      if (p->pClassSizes[iVar2] != 0) {
        __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswClass.c"
                      ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pClassSizes[iVar2] = 2;
      p->nClasses = p->nClasses + 1;
      p->nLits = p->nLits + 1;
      uVar9 = (ulong)(uint)vPairs->nSize;
      ppAVar6 = ppAVar6 + 2;
      iVar2 = (int)lVar7;
      lVar7 = lVar7 + 2;
    } while (iVar2 + 1 < vPairs->nSize);
  }
  p->pMemClassesFree = (Aig_Obj_t **)0x0;
  Ssw_ClassesCheck(p);
  return p;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple( Aig_Man_t * pMiter, Vec_Int_t * vPairs )
{
    Ssw_Cla_t * p;
    Aig_Obj_t ** ppClassNew;
    Aig_Obj_t * pObj, * pRepr;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pMiter );
    // allocate memory for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_IntSize(vPairs) );
    // create classes
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pRepr = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i) );
        pObj  = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i+1) );
        assert( Aig_ObjId(pRepr) < Aig_ObjId(pObj) );
        Aig_ObjSetRepr( pMiter, pObj, pRepr );
        // get room for storing the class
        ppClassNew = p->pMemClasses + i;
        ppClassNew[0] = pRepr;
        ppClassNew[1] = pObj;
        // create new class
        Ssw_ObjAddClass( p, pRepr, ppClassNew, 2 );
    }
    // prepare room for new classes
    p->pMemClassesFree = NULL;
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}